

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::redeclareBuiltinBlock
          (TParseContext *this,TSourceLoc *loc,TTypeList *newTypeList,TString *blockName,
          TString *instanceName,TArraySizes *arraySizes)

{
  pointer *pppTVar1;
  TSymbolTable *this_00;
  ulong uVar2;
  undefined8 uVar3;
  TType *right;
  TType *this_01;
  TArraySizes *pTVar4;
  TVector<glslang::TArraySize> *pTVar5;
  iterator __position;
  char cVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  uint uVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TSymbol *pTVar12;
  undefined4 extraout_var_01;
  ulong uVar13;
  long *plVar14;
  long lVar15;
  basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *this_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  undefined4 extraout_var_12;
  undefined4 extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  TString *pTVar16;
  undefined4 extraout_var_16;
  undefined4 extraout_var_17;
  undefined4 extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  undefined4 extraout_var_22;
  undefined4 extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  undefined4 extraout_var_27;
  undefined4 extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  undefined4 extraout_var_32;
  undefined4 extraout_var_33;
  undefined4 extraout_var_34;
  undefined4 extraout_var_35;
  undefined4 extraout_var_36;
  undefined4 extraout_var_37;
  undefined4 extraout_var_38;
  undefined4 extraout_var_39;
  undefined4 extraout_var_40;
  undefined4 extraout_var_41;
  undefined4 extraout_var_42;
  undefined4 extraout_var_43;
  undefined4 extraout_var_44;
  undefined4 extraout_var_45;
  undefined4 extraout_var_46;
  undefined4 extraout_var_47;
  undefined4 extraout_var_48;
  undefined4 extraout_var_49;
  TSmallArrayVector *pTVar17;
  undefined4 extraout_var_50;
  undefined4 extraout_var_51;
  undefined4 extraout_var_52;
  char *pcVar18;
  pointer pcVar19;
  char *pcVar20;
  undefined8 *puVar21;
  pointer pTVar22;
  undefined8 *__src;
  TSourceLoc *pTVar23;
  TType *pTVar24;
  char *pcVar25;
  _func_int *UNRECOVERED_JUMPTABLE;
  _func_int **pp_Var26;
  undefined8 *__dest;
  bool builtIn;
  TSourceLoc memberLoc;
  bool local_91;
  TSourceLoc *local_90;
  TSourceLoc local_88;
  long *local_68;
  TParseContext *local_60;
  TSymbol *local_58;
  TArraySizes *local_50;
  ulong local_48;
  TString *local_40;
  TString *local_38;
  undefined4 extraout_var_02;
  
  local_40 = instanceName;
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,8,0x140,2,(char **)AEP_shader_io_blocks,
             "built-in block redeclaration");
  TParseVersions::profileRequires
            ((TParseVersions *)this,loc,-9,0x19a,"GL_ARB_separate_shader_objects",
             "built-in block redeclaration");
  iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
          compare(blockName,"gl_PerVertex");
  if (((((iVar8 != 0) &&
        (iVar8 = std::__cxx11::
                 basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                           (blockName,"gl_PerFragment"), iVar8 != 0)) &&
       (iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (blockName,"gl_MeshPerVertexNV"), iVar8 != 0)) &&
      ((iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (blockName,"gl_MeshPerPrimitiveNV"), iVar8 != 0 &&
       (iVar8 = std::__cxx11::
                basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                          (blockName,"gl_MeshPerVertexEXT"), iVar8 != 0)))) &&
     (iVar8 = std::__cxx11::
              basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::compare
                        (blockName,"gl_MeshPerPrimitiveEXT"), iVar8 != 0)) {
    pcVar25 = (blockName->_M_dataplus)._M_p;
    UNRECOVERED_JUMPTABLE =
         (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
    pcVar20 = "cannot redeclare block: ";
    pcVar18 = "block declaration";
LAB_004b1330:
    (*UNRECOVERED_JUMPTABLE)(this,loc,pcVar20,pcVar18,pcVar25,UNRECOVERED_JUMPTABLE);
    return;
  }
  pTVar16 = local_40;
  local_90 = loc;
  local_50 = arraySizes;
  if (local_40 == (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_> *)0x0)
  {
    this_00 = (this->super_TParseContextBase).symbolTable;
    iVar8 = (*((newTypeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[6])();
    pTVar12 = TSymbolTable::find(this_00,(TString *)CONCAT44(extraout_var,iVar8),&local_91,
                                 (bool *)0x0,(int *)0x0);
    iVar8 = (*((newTypeList->
               super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
               super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
               _M_impl.super__Vector_impl_data._M_start)->type->_vptr_TType[6])();
    pTVar16 = (TString *)CONCAT44(extraout_var_00,iVar8);
  }
  else {
    iVar8 = std::__cxx11::basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
            ::compare(local_40,0,3,"gl_");
    if (iVar8 != 0) {
      pcVar18 = (pTVar16->_M_dataplus)._M_p;
      UNRECOVERED_JUMPTABLE =
           (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
      pcVar20 = "cannot redeclare a built-in block with a user name";
      pcVar25 = "";
      goto LAB_004b1330;
    }
    pTVar12 = TSymbolTable::find((this->super_TParseContextBase).symbolTable,pTVar16,&local_91,
                                 (bool *)0x0,(int *)0x0);
  }
  pcVar19 = (pTVar16->_M_dataplus)._M_p;
  if (pTVar12 == (TSymbol *)0x0) {
    pp_Var26 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar25 = "no declaration found for redeclaration";
  }
  else if (local_91 == false) {
    pcVar19 = (blockName->_M_dataplus)._M_p;
    pp_Var26 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar25 = "can only redeclare a built-in block once, and before any use";
  }
  else {
    pTVar12 = TSymbolTable::copyUpDeferredInsert
                        ((this->super_TParseContextBase).symbolTable,pTVar12);
    local_58 = pTVar12;
    iVar8 = (*pTVar12->_vptr_TSymbol[0xc])(pTVar12);
    iVar8 = (**(code **)(*(long *)CONCAT44(extraout_var_01,iVar8) + 0x38))
                      ((long *)CONCAT44(extraout_var_01,iVar8));
    if (iVar8 == 0x10) {
      if (((*(uint *)&(this->currentBlockQualifier).field_0x8 & 0x7f) == 4) &&
         (uVar13 = (ulong)((uint)*(undefined8 *)&(this->globalOutputDefaults).field_0x24 & 0xf),
         uVar13 != 0xf)) {
        uVar2 = *(ulong *)&(this->currentBlockQualifier).field_0x24;
        if ((~(uint)uVar2 & 0xf) == 0) {
          *(ulong *)&(this->currentBlockQualifier).field_0x24 = uVar2 & 0xfffffffffffffff0 | uVar13;
        }
        uVar13 = *(ulong *)&(this->currentBlockQualifier).field_0x1c;
        if (0xfeffffffffffffff < uVar13) {
          *(ulong *)&(this->currentBlockQualifier).field_0x1c =
               uVar13 & 0xffffffffffffff |
               *(ulong *)&(this->globalOutputDefaults).field_0x1c & 0xff00000000000000;
        }
        fixXfbOffsets(this,&this->currentBlockQualifier,newTypeList);
      }
      iVar8 = (*pTVar12->_vptr_TSymbol[0xd])(pTVar12);
      plVar14 = (long *)CONCAT44(extraout_var_02,iVar8);
      if ((this->currentBlockQualifier).layoutPassthrough == true) {
        lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
        *(undefined1 *)(lVar15 + 0x2f) = 1;
        uVar3 = *(undefined8 *)&(this->currentBlockQualifier).field_0x8;
        lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
        *(ulong *)(lVar15 + 8) =
             *(ulong *)(lVar15 + 8) & 0xffffffffffffff80 | (ulong)((uint)uVar3 & 0x7f);
        uVar13 = *(ulong *)&(this->currentBlockQualifier).field_0x1c;
        lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
        *(ulong *)(lVar15 + 0x1c) =
             *(ulong *)(lVar15 + 0x1c) & 0xffffffffffffff | uVar13 & 0xff00000000000000;
        uVar3 = *(undefined8 *)&(this->currentBlockQualifier).field_0x24;
        lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
        *(ulong *)(lVar15 + 0x24) =
             *(ulong *)(lVar15 + 0x24) & 0xfffffffffffffff0 | (ulong)((uint)uVar3 & 0xf);
      }
      local_38 = blockName;
      cVar6 = (**(code **)(*plVar14 + 0x128))(plVar14);
      if (cVar6 != '\0') {
        __dest = *(undefined8 **)(plVar14[0xd] + 8);
        cVar6 = (**(code **)(*plVar14 + 0x128))(plVar14);
        if (cVar6 != '\0') {
          local_48 = 0;
          local_68 = plVar14;
          local_60 = this;
          do {
            if (__dest == *(undefined8 **)(plVar14[0xd] + 0x10)) {
              if (0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) {
                uVar13 = *(ulong *)&(this->currentBlockQualifier).field_0x1c;
                lVar15 = (**(code **)(*plVar14 + 0x50))(plVar14);
                *(ulong *)(lVar15 + 0x1c) =
                     *(ulong *)(lVar15 + 0x1c) & 0xffffffffffffff | uVar13 & 0xff00000000000000;
              }
              pTVar16 = local_38;
              pTVar23 = local_90;
              if (local_48 <
                  (ulong)((long)(newTypeList->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(newTypeList->
                                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ).
                                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 5)) {
                (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                          (this,local_90,"block redeclaration has extra members",
                           (local_38->_M_dataplus)._M_p,"");
              }
              cVar6 = (**(code **)(*plVar14 + 0xe8))(plVar14);
              pTVar4 = local_50;
              pcVar25 = "cannot change arrayness of redeclared block";
              if ((local_50 != (TArraySizes *)0x0) == (bool)cVar6) {
                cVar6 = (**(code **)(*plVar14 + 0xe8))();
                if ((pTVar4 != (TArraySizes *)0x0) && (cVar6 != '\0')) {
                  lVar15 = (**(code **)(*local_68 + 0xa0))();
                  lVar15 = *(long *)(lVar15 + 8);
                  iVar8 = 0;
                  iVar9 = 0;
                  if (lVar15 != 0) {
                    iVar9 = (int)((ulong)(*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8)) >> 4);
                  }
                  pTVar5 = (pTVar4->sizes).sizes;
                  if (pTVar5 != (TVector<glslang::TArraySize> *)0x0) {
                    iVar8 = (int)((ulong)((long)(pTVar5->
                                                super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                                ).
                                                super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                                ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(pTVar5->
                                               super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                               ).
                                               super__Vector_base<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                                               ._M_impl.super__Vector_impl_data._M_start) >> 4);
                  }
                  if (iVar9 != iVar8) goto LAB_004b1fbb;
                }
                plVar14 = local_68;
                cVar6 = (**(code **)(*local_68 + 0xe8))(local_68);
                if (cVar6 == '\0') goto LAB_004b20ea;
                uVar11 = TSmallArrayVector::frontSize(&pTVar4->sizes);
                if ((uVar11 == 0) &&
                   (cVar6 = (**(code **)(*plVar14 + 0xf0))(plVar14), cVar6 != '\0')) {
                  uVar11 = (**(code **)(*plVar14 + 0x78))(plVar14);
                  TSmallArrayVector::changeFront(&pTVar4->sizes,uVar11);
                  pTVar4->implicitlySized = false;
                }
                cVar6 = (**(code **)(*plVar14 + 0xf0))(plVar14);
                if ((cVar6 == '\0') &&
                   (uVar11 = TSmallArrayVector::frontSize(&pTVar4->sizes), uVar11 != 0)) {
                  uVar11 = TSmallArrayVector::frontSize(&pTVar4->sizes);
                  pTVar17 = (TSmallArrayVector *)plVar14[0xc];
                  TSmallArrayVector::changeFront(pTVar17,uVar11);
                  *(undefined1 *)((long)&pTVar17[1]._vptr_TSmallArrayVector + 4) = 0;
                }
                cVar6 = (**(code **)(*plVar14 + 0xf0))(plVar14);
                if (cVar6 == '\0') goto LAB_004b20ea;
                pTVar17 = (TSmallArrayVector *)(**(code **)(*plVar14 + 0xa0))(plVar14);
                bVar7 = TSmallArrayVector::operator==(pTVar17,&pTVar4->sizes);
                if (bVar7) goto LAB_004b20ea;
                pcVar25 = "cannot change array size of redeclared block";
              }
LAB_004b1fbb:
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                        (this,pTVar23,pcVar25,(pTVar16->_M_dataplus)._M_p,"");
LAB_004b20ea:
              pTVar12 = local_58;
              TSymbolTable::insert((this->super_TParseContextBase).symbolTable,local_58);
              layoutObjectCheck(this,pTVar23,pTVar12);
              iVar8 = (*pTVar12->_vptr_TSymbol[0xc])(pTVar12);
              bVar7 = isIoResizeArray(this,(TType *)CONCAT44(extraout_var_50,iVar8));
              if (bVar7) {
                __position._M_current =
                     (this->ioArraySymbolResizeList).
                     super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                     super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
                if (__position._M_current ==
                    (this->ioArraySymbolResizeList).
                    super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>.
                    super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage) {
                  std::vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>>::
                  _M_realloc_insert<glslang::TSymbol*const&>
                            ((vector<glslang::TSymbol*,glslang::pool_allocator<glslang::TSymbol*>> *
                             )&this->ioArraySymbolResizeList,__position,&local_58);
                }
                else {
                  *__position._M_current = pTVar12;
                  pppTVar1 = &(this->ioArraySymbolResizeList).
                              super_vector<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                              .
                              super__Vector_base<glslang::TSymbol_*,_glslang::pool_allocator<glslang::TSymbol_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish;
                  *pppTVar1 = *pppTVar1 + 1;
                }
                checkIoArraysConsistency(this,pTVar23,true);
                pTVar12 = local_58;
              }
              else {
                iVar8 = (*pTVar12->_vptr_TSymbol[0xc])(pTVar12);
                cVar6 = (**(code **)(*(long *)CONCAT44(extraout_var_51,iVar8) + 0xe8))
                                  ((long *)CONCAT44(extraout_var_51,iVar8));
                if (cVar6 != '\0') {
                  iVar8 = (*pTVar12->_vptr_TSymbol[0xd])(pTVar12);
                  fixIoArraySize(this,pTVar23,(TType *)CONCAT44(extraout_var_52,iVar8));
                }
              }
              (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x4d])
                        (this,pTVar12);
              return;
            }
            local_88.name = (TString *)0x0;
            local_88.string = 0;
            local_88.line = 0;
            local_88._16_8_ = local_88._16_8_ & 0xffffffff00000000;
            for (pTVar22 = (newTypeList->
                           super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ).
                           super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                pTVar22 !=
                (newTypeList->
                super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>).
                super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>.
                _M_impl.super__Vector_impl_data._M_finish; pTVar22 = pTVar22 + 1) {
              this_02 = (basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                         *)(**(code **)(*(long *)*__dest + 0x30))();
              iVar8 = (*pTVar22->type->_vptr_TType[6])();
              iVar8 = std::__cxx11::
                      basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>::
                      compare(this_02,(basic_string<char,_std::char_traits<char>,_glslang::pool_allocator<char>_>
                                       *)CONCAT44(extraout_var_03,iVar8));
              if (iVar8 == 0) {
                local_88._16_8_ = *(undefined8 *)&(pTVar22->loc).column;
                local_88.name = (pTVar22->loc).name;
                local_88.string = (pTVar22->loc).string;
                local_88.line = (pTVar22->loc).line;
                right = (TType *)*__dest;
                this_01 = pTVar22->type;
                pTVar24 = right;
                if (right->field_0x8 == this_01->field_0x8) {
                  bVar7 = TType::sameElementShape(this_01,right,(int *)0x0,(int *)0x0);
                  if (!bVar7) {
                    pTVar24 = (TType *)*__dest;
                    goto LAB_004b166a;
                  }
                }
                else {
LAB_004b166a:
                  iVar8 = (*pTVar24->_vptr_TType[6])();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_88,"cannot redeclare block member with a different type",
                             *(undefined8 *)(CONCAT44(extraout_var_04,iVar8) + 8),"");
                }
                iVar8 = (*right->_vptr_TType[0x1d])(right);
                iVar9 = (*this_01->_vptr_TType[0x1d])(this_01);
                if ((char)iVar8 == (char)iVar9) {
                  iVar8 = (*right->_vptr_TType[10])(right);
                  if ((((*(ulong *)(CONCAT44(extraout_var_05,iVar8) + 8) & 0x40000000000) != 0) ||
                      (bVar7 = TType::sameArrayness(right,this_01), bVar7)) ||
                     (iVar8 = (*right->_vptr_TType[0x1e])(right), (char)iVar8 == '\0')) {
                    iVar8 = (*right->_vptr_TType[10])(right);
                    if (((*(ulong *)(CONCAT44(extraout_var_06,iVar8) + 8) & 0x40000000000) == 0) &&
                       (iVar8 = (*this_01->_vptr_TType[0x1d])(this_01), (char)iVar8 != '\0')) {
                      pTVar16 = (TString *)(**(code **)(*(long *)*__dest + 0x30))();
                      iVar8 = (*this_01->_vptr_TType[0xf])(this_01);
                      arrayLimitCheck(this,local_90,pTVar16,iVar8);
                    }
                  }
                  else {
                    lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                      [0x2d])(this,&local_88,"cannot change array size of redeclared block member",
                              *(undefined8 *)(lVar15 + 8),"");
                  }
                }
                else {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_88,"cannot change arrayness of redeclared block member",
                             *(undefined8 *)(lVar15 + 8),"");
                }
                iVar8 = (*right->_vptr_TType[10])(right);
                if (((*(ulong *)(CONCAT44(extraout_var_07,iVar8) + 8) & 0x40000000000) == 0) ||
                   (iVar8 = (*this_01->_vptr_TType[0xb])(this_01),
                   (*(ulong *)(CONCAT44(extraout_var_08,iVar8) + 8) & 0x40000000000) != 0)) {
                  iVar8 = (*right->_vptr_TType[10])(right);
                  if (((*(ulong *)(CONCAT44(extraout_var_09,iVar8) + 8) & 0x40000000000) == 0) &&
                     (iVar8 = (*this_01->_vptr_TType[0xb])(this_01),
                     (*(ulong *)(CONCAT44(extraout_var_10,iVar8) + 8) & 0x40000000000) != 0)) {
                    lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                    pcVar25 = *(char **)(lVar15 + 8);
                    pp_Var26 = (this->super_TParseContextBase).super_TParseVersions.
                               _vptr_TParseVersions;
                    pTVar23 = &local_88;
                    pcVar18 = "cannot add perviewNV qualifier to redeclared block member";
                    goto LAB_004b1994;
                  }
                  iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                  if ((*(ulong *)(CONCAT44(extraout_var_11,iVar8) + 8) & 0x40000000000) != 0) {
                    iVar8 = (*right->_vptr_TType[0x14])(right);
                    lVar15 = *(long *)(CONCAT44(extraout_var_12,iVar8) + 8);
                    iVar8 = 0;
                    iVar9 = 0;
                    if (lVar15 != 0) {
                      iVar9 = (int)((ulong)(*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8)) >> 4);
                    }
                    iVar10 = (*this_01->_vptr_TType[0x13])(this_01);
                    lVar15 = *(long *)(CONCAT44(extraout_var_13,iVar10) + 8);
                    if (lVar15 != 0) {
                      iVar8 = (int)((ulong)(*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8)) >> 4);
                    }
                    if (iVar9 == iVar8) {
                      iVar8 = (*this_01->_vptr_TType[0x1f])(this_01);
                      this = local_60;
                      if (((char)iVar8 != '\0') ||
                         (iVar8 = (*this_01->_vptr_TType[0xf])(this_01),
                         iVar8 == (this->resources).maxMeshViewCountNV)) {
                        iVar8 = (*this_01->_vptr_TType[0x13])(this_01);
                        lVar15 = *(long *)(CONCAT44(extraout_var_14,iVar8) + 8);
                        if ((lVar15 != 0) &&
                           ((*(long *)(lVar15 + 0x10) - *(long *)(lVar15 + 8) & 0xffffffff0U) ==
                            0x20)) {
                          iVar8 = (*this_01->_vptr_TType[0x13])(this_01);
                          uVar11 = TSmallArrayVector::getDimSize
                                             ((TSmallArrayVector *)CONCAT44(extraout_var_15,iVar8),1
                                             );
                          pTVar16 = (TString *)(**(code **)(*(long *)*__dest + 0x30))();
                          arrayLimitCheck(this,&local_88,pTVar16,uVar11);
                          iVar8 = (*right->_vptr_TType[0x14])(right);
                          TSmallArrayVector::setDimSize
                                    ((TSmallArrayVector *)CONCAT44(extraout_var_16,iVar8),1,uVar11);
                        }
                        goto LAB_004b19a4;
                      }
                      pp_Var26 = (this->super_TParseContextBase).super_TParseVersions.
                                 _vptr_TParseVersions;
                      pcVar18 = 
                      "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized"
                      ;
                      pcVar25 = "[]";
                      pTVar23 = local_90;
                    }
                    else {
                      lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                      pcVar25 = *(char **)(lVar15 + 8);
                      pp_Var26 = (local_60->super_TParseContextBase).super_TParseVersions.
                                 _vptr_TParseVersions;
                      pTVar23 = &local_88;
                      pcVar18 = "cannot change arrayness of redeclared block member";
                      this = local_60;
                    }
                    goto LAB_004b1994;
                  }
                }
                else {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  pcVar25 = *(char **)(lVar15 + 8);
                  pp_Var26 = (this->super_TParseContextBase).super_TParseVersions.
                             _vptr_TParseVersions;
                  pcVar18 = "missing perviewNV qualifier to redeclared block member";
                  pTVar23 = &local_88;
LAB_004b1994:
                  (*pp_Var26[0x2d])(this,pTVar23,pcVar18,pcVar25,"");
                }
LAB_004b19a4:
                iVar8 = (*right->_vptr_TType[10])(right);
                if ((*(ulong *)(CONCAT44(extraout_var_17,iVar8) + 8) & 0x20000000000) == 0) {
LAB_004b19d4:
                  iVar8 = (*right->_vptr_TType[10])(right);
                  if ((*(ulong *)(CONCAT44(extraout_var_19,iVar8) + 8) & 0x20000000000) == 0) {
                    iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                    pcVar25 = "cannot add perprimitiveNV qualifier to redeclared block member";
                    if ((*(ulong *)(CONCAT44(extraout_var_20,iVar8) + 8) & 0x20000000000) != 0)
                    goto LAB_004b19fa;
                  }
                }
                else {
                  iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                  pcVar25 = "missing perprimitiveNV qualifier to redeclared block member";
                  if ((*(ulong *)(CONCAT44(extraout_var_18,iVar8) + 8) & 0x20000000000) != 0)
                  goto LAB_004b19d4;
LAB_004b19fa:
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(local_60->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
                    [0x2d])(local_60,&local_88,pcVar25,*(undefined8 *)(lVar15 + 8),"");
                }
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                this = local_60;
                if ((*(uint *)(CONCAT44(extraout_var_21,iVar8) + 0xc) & 0x3ffc000) != 0) {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_88,"cannot add memory qualifier to redeclared block member"
                             ,*(undefined8 *)(lVar15 + 8),"");
                }
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                bVar7 = TQualifier::hasNonXfbLayout((TQualifier *)CONCAT44(extraout_var_22,iVar8));
                if (bVar7) {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_88,"cannot add non-XFB layout to redeclared block member",
                             *(undefined8 *)(lVar15 + 8),"");
                }
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                if ((*(byte *)(CONCAT44(extraout_var_23,iVar8) + 0xd) & 0x10) != 0) {
                  lVar15 = (**(code **)(*(long *)*__dest + 0x30))();
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_88,"cannot add patch to redeclared block member",
                             *(undefined8 *)(lVar15 + 8),"");
                }
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                if (((~*(uint *)(CONCAT44(extraout_var_24,iVar8) + 0x24) & 0xf) != 0) &&
                   (iVar8 = (*this_01->_vptr_TType[0xb])(this_01),
                   ((*(uint *)&(this->currentBlockQualifier).field_0x24 ^
                    *(uint *)(CONCAT44(extraout_var_25,iVar8) + 0x24)) & 0xf) != 0)) {
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_88,
                             "member cannot contradict block (or what block inherited from global)",
                             "xfb_buffer","");
                }
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                if ((*(ulong *)(CONCAT44(extraout_var_26,iVar8) + 0x1c) < 0xff00000000000000) &&
                   (iVar8 = (*this_01->_vptr_TType[0xb])(this_01),
                   0xffffffffffffff <
                   (*(ulong *)&(this->currentBlockQualifier).field_0x1c ^
                   *(ulong *)(CONCAT44(extraout_var_27,iVar8) + 0x1c)))) {
                  (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                            (this,&local_88,
                             "member cannot contradict block (or what block inherited from global)",
                             "xfb_stream","");
                }
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar3 = *(undefined8 *)(CONCAT44(extraout_var_28,iVar8) + 8);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_29,iVar8) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_29,iVar8) + 8) & 0xffffffffdfffffff |
                     (ulong)((uint)uVar3 & 0x20000000);
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar13 = *(ulong *)(CONCAT44(extraout_var_30,iVar8) + 8);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_31,iVar8) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_31,iVar8) + 8) & 0xffffdfffffffffff |
                     uVar13 & 0x200000000000;
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar3 = *(undefined8 *)(CONCAT44(extraout_var_32,iVar8) + 8);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_33,iVar8) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_33,iVar8) + 8) & 0xffffffffefffffff |
                     (ulong)((uint)uVar3 & 0x10000000);
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar13 = *(ulong *)(CONCAT44(extraout_var_34,iVar8) + 8);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_35,iVar8) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_35,iVar8) + 8) & 0xffffffefffffffff |
                     uVar13 & 0x1000000000;
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar3 = *(undefined8 *)(CONCAT44(extraout_var_36,iVar8) + 8);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_37,iVar8) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_37,iVar8) + 8) & 0xffffffffbfffffff |
                     (ulong)((uint)uVar3 & 0x40000000);
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar3 = *(undefined8 *)(CONCAT44(extraout_var_38,iVar8) + 8);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_39,iVar8) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_39,iVar8) + 8) & 0xffffffff7fffffff |
                     (ulong)((uint)uVar3 & 0x80000000);
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar13 = *(ulong *)(CONCAT44(extraout_var_40,iVar8) + 8);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_41,iVar8) + 8) =
                     *(ulong *)(CONCAT44(extraout_var_41,iVar8) + 8) & 0xffffffdfffffffff |
                     uVar13 & 0x2000000000;
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar3 = *(undefined8 *)(CONCAT44(extraout_var_42,iVar8) + 0x24);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_43,iVar8) + 0x24) =
                     *(ulong *)(CONCAT44(extraout_var_43,iVar8) + 0x24) & 0xffffffff8003ffff |
                     (ulong)((uint)uVar3 & 0x7ffc0000);
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar3 = *(undefined8 *)(CONCAT44(extraout_var_44,iVar8) + 0x24);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_45,iVar8) + 0x24) =
                     *(ulong *)(CONCAT44(extraout_var_45,iVar8) + 0x24) & 0xfffffffffffffff0 |
                     (ulong)((uint)uVar3 & 0xf);
                iVar8 = (*this_01->_vptr_TType[0xb])(this_01);
                uVar3 = *(undefined8 *)(CONCAT44(extraout_var_46,iVar8) + 0x24);
                iVar8 = (*right->_vptr_TType[10])(right);
                *(ulong *)(CONCAT44(extraout_var_47,iVar8) + 0x24) =
                     *(ulong *)(CONCAT44(extraout_var_47,iVar8) + 0x24) & 0xfffffffffffc000f |
                     (ulong)((uint)uVar3 & 0x3fff0);
                iVar8 = (*right->_vptr_TType[10])(right);
                if ((*(uint *)(CONCAT44(extraout_var_48,iVar8) + 0x24) & 0x7ffc0000) != 0x3c0000) {
                  uVar3 = *(undefined8 *)&(this->currentBlockQualifier).field_0x24;
                  lVar15 = (**(code **)(*local_68 + 0x50))();
                  *(ulong *)(lVar15 + 0x24) =
                       *(ulong *)(lVar15 + 0x24) & 0xfffffffffffffff0 | (ulong)((uint)uVar3 & 0xf);
                  uVar3 = *(undefined8 *)&(this->currentBlockQualifier).field_0x24;
                  iVar8 = (*right->_vptr_TType[10])(right);
                  *(ulong *)(CONCAT44(extraout_var_49,iVar8) + 0x24) =
                       *(ulong *)(CONCAT44(extraout_var_49,iVar8) + 0x24) & 0xfffffffffffffff0 |
                       (ulong)((uint)uVar3 & 0xf);
                }
                iVar8 = (*right->_vptr_TType[0x1f])(right);
                if (((char)iVar8 != '\0') &&
                   (iVar8 = (*this_01->_vptr_TType[0x1e])(this_01), (char)iVar8 != '\0')) {
                  uVar11 = (*this_01->_vptr_TType[0xf])(this_01);
                  pTVar4 = right->arraySizes;
                  TSmallArrayVector::changeFront(&pTVar4->sizes,uVar11);
                  pTVar4->implicitlySized = false;
                }
                local_48 = local_48 + 1;
                layoutTypeCheck(this,local_90,right);
                __dest = __dest + 4;
                plVar14 = local_68;
                goto LAB_004b1e82;
              }
            }
            if (local_40 == (TString *)0x0) {
              (**(code **)(*(long *)*__dest + 0x10))();
              __dest = __dest + 4;
            }
            else {
              cVar6 = (**(code **)(*plVar14 + 0x128))(plVar14);
              if (cVar6 == '\0') goto LAB_004b21de;
              lVar15 = plVar14[0xd];
              __src = __dest + 4;
              puVar21 = *(undefined8 **)(lVar15 + 0x10);
              if (__src != puVar21) {
                memmove(__dest,__src,(long)puVar21 - (long)__src);
                puVar21 = *(undefined8 **)(lVar15 + 0x10);
              }
              *(undefined8 **)(lVar15 + 0x10) = puVar21 + -4;
            }
LAB_004b1e82:
            cVar6 = (**(code **)(*plVar14 + 0x128))(plVar14);
          } while (cVar6 != '\0');
        }
        __assert_fail("isStruct()",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                      ,0x9df,"const TTypeList *glslang::TType::getStruct() const");
      }
LAB_004b21de:
      __assert_fail("isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/Types.h"
                    ,0x9e1,"TTypeList *glslang::TType::getWritableStruct() const");
    }
    pp_Var26 = (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar25 = "cannot redeclare a non block as a block";
  }
  (*pp_Var26[0x2d])(this,local_90,pcVar25,pcVar19,"");
  return;
}

Assistant:

void TParseContext::redeclareBuiltinBlock(const TSourceLoc& loc, TTypeList& newTypeList, const TString& blockName,
    const TString* instanceName, TArraySizes* arraySizes)
{
    const char* feature = "built-in block redeclaration";
    profileRequires(loc, EEsProfile, 320, Num_AEP_shader_io_blocks, AEP_shader_io_blocks, feature);
    profileRequires(loc, ~EEsProfile, 410, E_GL_ARB_separate_shader_objects, feature);

    if (blockName != "gl_PerVertex" && blockName != "gl_PerFragment" &&
        blockName != "gl_MeshPerVertexNV" && blockName != "gl_MeshPerPrimitiveNV" &&
        blockName != "gl_MeshPerVertexEXT" && blockName != "gl_MeshPerPrimitiveEXT") {
        error(loc, "cannot redeclare block: ", "block declaration", blockName.c_str());
        return;
    }

    // Redeclaring a built-in block...

    if (instanceName && ! builtInName(*instanceName)) {
        error(loc, "cannot redeclare a built-in block with a user name", instanceName->c_str(), "");
        return;
    }

    // Blocks with instance names are easy to find, lookup the instance name,
    // Anonymous blocks need to be found via a member.
    bool builtIn;
    TSymbol* block;
    if (instanceName)
        block = symbolTable.find(*instanceName, &builtIn);
    else
        block = symbolTable.find(newTypeList.front().type->getFieldName(), &builtIn);

    // If the block was not found, this must be a version/profile/stage
    // that doesn't have it, or the instance name is wrong.
    const char* errorName = instanceName ? instanceName->c_str() : newTypeList.front().type->getFieldName().c_str();
    if (! block) {
        error(loc, "no declaration found for redeclaration", errorName, "");
        return;
    }
    // Built-in blocks cannot be redeclared more than once, which if happened,
    // we'd be finding the already redeclared one here, rather than the built in.
    if (! builtIn) {
        error(loc, "can only redeclare a built-in block once, and before any use", blockName.c_str(), "");
        return;
    }

    // Copy the block to make a writable version, to insert into the block table after editing.
    block = symbolTable.copyUpDeferredInsert(block);

    if (block->getType().getBasicType() != EbtBlock) {
        error(loc, "cannot redeclare a non block as a block", errorName, "");
        return;
    }

    // Fix XFB stuff up, it applies to the order of the redeclaration, not
    // the order of the original members.
    if (currentBlockQualifier.storage == EvqVaryingOut && globalOutputDefaults.hasXfbBuffer()) {
        if (!currentBlockQualifier.hasXfbBuffer())
            currentBlockQualifier.layoutXfbBuffer = globalOutputDefaults.layoutXfbBuffer;
        if (!currentBlockQualifier.hasStream())
            currentBlockQualifier.layoutStream = globalOutputDefaults.layoutStream;
        fixXfbOffsets(currentBlockQualifier, newTypeList);
    }

    // Edit and error check the container against the redeclaration
    //  - remove unused members
    //  - ensure remaining qualifiers/types match

    TType& type = block->getWritableType();

    // if gl_PerVertex is redeclared for the purpose of passing through "gl_Position"
    // for passthrough purpose, the redeclared block should have the same qualifers as
    // the current one
    if (currentBlockQualifier.layoutPassthrough) {
        type.getQualifier().layoutPassthrough = currentBlockQualifier.layoutPassthrough;
        type.getQualifier().storage = currentBlockQualifier.storage;
        type.getQualifier().layoutStream = currentBlockQualifier.layoutStream;
        type.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
    }

    TTypeList::iterator member = type.getWritableStruct()->begin();
    size_t numOriginalMembersFound = 0;
    while (member != type.getStruct()->end()) {
        // look for match
        bool found = false;
        TTypeList::const_iterator newMember;
        TSourceLoc memberLoc;
        memberLoc.init();
        for (newMember = newTypeList.begin(); newMember != newTypeList.end(); ++newMember) {
            if (member->type->getFieldName() == newMember->type->getFieldName()) {
                found = true;
                memberLoc = newMember->loc;
                break;
            }
        }

        if (found) {
            ++numOriginalMembersFound;
            // - ensure match between redeclared members' types
            // - check for things that can't be changed
            // - update things that can be changed
            TType& oldType = *member->type;
            const TType& newType = *newMember->type;
            if (! newType.sameElementType(oldType))
                error(memberLoc, "cannot redeclare block member with a different type", member->type->getFieldName().c_str(), "");
            if (oldType.isArray() != newType.isArray())
                error(memberLoc, "cannot change arrayness of redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && ! oldType.sameArrayness(newType) && oldType.isSizedArray())
                error(memberLoc, "cannot change array size of redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && newType.isArray())
                arrayLimitCheck(loc, member->type->getFieldName(), newType.getOuterArraySize());
            if (oldType.getQualifier().isPerView() && ! newType.getQualifier().isPerView())
                error(memberLoc, "missing perviewNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerView() && newType.getQualifier().isPerView())
                error(memberLoc, "cannot add perviewNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (newType.getQualifier().isPerView()) {
                if (oldType.getArraySizes()->getNumDims() != newType.getArraySizes()->getNumDims())
                    error(memberLoc, "cannot change arrayness of redeclared block member", member->type->getFieldName().c_str(), "");
                else if (! newType.isUnsizedArray() && newType.getOuterArraySize() != resources.maxMeshViewCountNV)
                    error(loc, "mesh view output array size must be gl_MaxMeshViewCountNV or implicitly sized", "[]", "");
                else if (newType.getArraySizes()->getNumDims() == 2) {
                    int innerDimSize = newType.getArraySizes()->getDimSize(1);
                    arrayLimitCheck(memberLoc, member->type->getFieldName(), innerDimSize);
                    oldType.getArraySizes()->setDimSize(1, innerDimSize);
                }
            }
            if (oldType.getQualifier().isPerPrimitive() && ! newType.getQualifier().isPerPrimitive())
                error(memberLoc, "missing perprimitiveNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            else if (! oldType.getQualifier().isPerPrimitive() && newType.getQualifier().isPerPrimitive())
                error(memberLoc, "cannot add perprimitiveNV qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().isMemory())
                error(memberLoc, "cannot add memory qualifier to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().hasNonXfbLayout())
                error(memberLoc, "cannot add non-XFB layout to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().patch)
                error(memberLoc, "cannot add patch to redeclared block member", member->type->getFieldName().c_str(), "");
            if (newType.getQualifier().hasXfbBuffer() &&
                newType.getQualifier().layoutXfbBuffer != currentBlockQualifier.layoutXfbBuffer)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_buffer", "");
            if (newType.getQualifier().hasStream() &&
                newType.getQualifier().layoutStream != currentBlockQualifier.layoutStream)
                error(memberLoc, "member cannot contradict block (or what block inherited from global)", "xfb_stream", "");
            oldType.getQualifier().centroid = newType.getQualifier().centroid;
            oldType.getQualifier().sample = newType.getQualifier().sample;
            oldType.getQualifier().invariant = newType.getQualifier().invariant;
            oldType.getQualifier().noContraction = newType.getQualifier().noContraction;
            oldType.getQualifier().smooth = newType.getQualifier().smooth;
            oldType.getQualifier().flat = newType.getQualifier().flat;
            oldType.getQualifier().nopersp = newType.getQualifier().nopersp;
            oldType.getQualifier().layoutXfbOffset = newType.getQualifier().layoutXfbOffset;
            oldType.getQualifier().layoutXfbBuffer = newType.getQualifier().layoutXfbBuffer;
            oldType.getQualifier().layoutXfbStride = newType.getQualifier().layoutXfbStride;
            if (oldType.getQualifier().layoutXfbOffset != TQualifier::layoutXfbBufferEnd) {
                // If any member has an xfb_offset, then the block's xfb_buffer inherents current xfb_buffer,
                // and for xfb processing, the member needs it as well, along with xfb_stride.
                type.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
                oldType.getQualifier().layoutXfbBuffer = currentBlockQualifier.layoutXfbBuffer;
            }
            if (oldType.isUnsizedArray() && newType.isSizedArray())
                oldType.changeOuterArraySize(newType.getOuterArraySize());

            //  check and process the member's type, which will include managing xfb information
            layoutTypeCheck(loc, oldType);

            // go to next member
            ++member;
        } else {
            // For missing members of anonymous blocks that have been redeclared,
            // hide the original (shared) declaration.
            // Instance-named blocks can just have the member removed.
            if (instanceName)
                member = type.getWritableStruct()->erase(member);
            else {
                member->type->hideMember();
                ++member;
            }
        }
    }

    if (spvVersion.vulkan > 0) {
        // ...then streams apply to built-in blocks, instead of them being only on stream 0
        type.getQualifier().layoutStream = currentBlockQualifier.layoutStream;
    }

    if (numOriginalMembersFound < newTypeList.size())
        error(loc, "block redeclaration has extra members", blockName.c_str(), "");
    if (type.isArray() != (arraySizes != nullptr) ||
        (type.isArray() && arraySizes != nullptr && type.getArraySizes()->getNumDims() != arraySizes->getNumDims()))
        error(loc, "cannot change arrayness of redeclared block", blockName.c_str(), "");
    else if (type.isArray()) {
        // At this point, we know both are arrays and both have the same number of dimensions.

        // It is okay for a built-in block redeclaration to be unsized, and keep the size of the
        // original block declaration.
        if (!arraySizes->isSized() && type.isSizedArray())
            arraySizes->changeOuterSize(type.getOuterArraySize());

        // And, okay to be giving a size to the array, by the redeclaration
        if (!type.isSizedArray() && arraySizes->isSized())
            type.changeOuterArraySize(arraySizes->getOuterSize());

        // Now, they must match in all dimensions.
        if (type.isSizedArray() && *type.getArraySizes() != *arraySizes)
            error(loc, "cannot change array size of redeclared block", blockName.c_str(), "");
    }

    symbolTable.insert(*block);

    // Check for general layout qualifier errors
    layoutObjectCheck(loc, *block);

    // Tracking for implicit sizing of array
    if (isIoResizeArray(block->getType())) {
        ioArraySymbolResizeList.push_back(block);
        checkIoArraysConsistency(loc, true);
    } else if (block->getType().isArray())
        fixIoArraySize(loc, block->getWritableType());

    // Save it in the AST for linker use.
    trackLinkage(*block);
}